

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.h
# Opt level: O0

Node __thiscall trieste::detail::Make::done(Make *this)

{
  bool bVar1;
  element_type *peVar2;
  NodeDef *pNVar3;
  element_type *this_00;
  Location *pLVar4;
  runtime_error *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Make *in_RSI;
  Node NVar5;
  initializer_list<trieste::Token> local_c0;
  enable_shared_from_this<trieste::NodeDef> local_b0;
  initializer_list<trieste::Token> local_a0 [2];
  allocator<char> local_79;
  string local_78 [32];
  string local_58;
  initializer_list<trieste::Token> local_28;
  Make *this_local;
  
  this_local = this;
  CLI::std::initializer_list<trieste::Token>::initializer_list(&stack0xffffffffffffffd8);
  term(in_RSI,local_28);
  while( true ) {
    peVar2 = CLI::std::
             __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&in_RSI->node);
    pNVar3 = NodeDef::parent(peVar2);
    if (pNVar3 == (NodeDef *)0x0) break;
    peVar2 = CLI::std::
             __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&in_RSI->node);
    this_00 = CLI::std::
              __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&in_RSI->node);
    pLVar4 = NodeDef::location(this_00);
    Location::Location((Location *)&local_58,pLVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_78,"this is unclosed",&local_79);
    make_error((Make *)&stack0xffffffffffffffc8,(Location *)in_RSI,&local_58);
    NodeDef::push_back(peVar2,(Node *)&stack0xffffffffffffffc8);
    CLI::std::shared_ptr<trieste::NodeDef>::~shared_ptr
              ((shared_ptr<trieste::NodeDef> *)&stack0xffffffffffffffc8);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator(&local_79);
    Location::~Location((Location *)&local_58);
    CLI::std::initializer_list<trieste::Token>::initializer_list(local_a0);
    term(in_RSI,local_a0[0]);
    peVar2 = CLI::std::
             __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&in_RSI->node);
    NodeDef::parent(peVar2);
    CLI::std::enable_shared_from_this<trieste::NodeDef>::shared_from_this(&local_b0);
    CLI::std::shared_ptr<trieste::NodeDef>::operator=
              (&in_RSI->node,(shared_ptr<trieste::NodeDef> *)&local_b0);
    CLI::std::shared_ptr<trieste::NodeDef>::~shared_ptr((shared_ptr<trieste::NodeDef> *)&local_b0);
    CLI::std::initializer_list<trieste::Token>::initializer_list(&local_c0);
    term(in_RSI,local_c0);
  }
  bVar1 = std::operator==(&in_RSI->node,&in_RSI->top);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    CLI::std::shared_ptr<trieste::NodeDef>::shared_ptr(&this->top,&in_RSI->top);
    NVar5.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    NVar5.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (Node)NVar5.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"malformed AST");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Node done()
      {
        term();

        while (node->parent())
        {
          node->push_back(make_error(node->location(), "this is unclosed"));
          term();
          node = node->parent()->shared_from_this();
          term();
        }

        if (node != top)
          throw std::runtime_error("malformed AST");

        return top;
      }